

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O2

void __thiscall TextEntry::draw(TextEntry *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  Theme *pTVar11;
  ALLEGRO_FONT *pAVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  uint end;
  undefined8 in_XMM1_Qa;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined4 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  int post_cursor;
  undefined4 local_498;
  UString sub;
  UString local_440;
  SaveState state;
  
  pTVar11 = ((this->super_Widget).dialog)->theme;
  al_store_state(&state,0xffff);
  uVar22._0_4_ = (pTVar11->bg).r;
  uVar22._4_4_ = (pTVar11->bg).g;
  uVar23._0_4_ = (pTVar11->bg).b;
  uVar23._4_4_ = (pTVar11->bg).a;
  iVar13 = (*(this->super_Widget)._vptr_Widget[0x10])(this);
  if ((char)iVar13 != '\0') {
    uVar22 = al_map_rgb(0x40,0x40,0x40);
    uVar23 = in_XMM1_Qa;
  }
  uVar19 = CONCAT44((int)((ulong)in_XMM1_Qa >> 0x20),(float)(this->super_Widget).y1);
  al_draw_filled_rectangle
            ((float)(this->super_Widget).x1,uVar19,(float)(this->super_Widget).x2,
             (float)(this->super_Widget).y2,uVar22,uVar23);
  uVar21 = (undefined4)((ulong)uVar19 >> 0x20);
  al_set_blender(0,1,3);
  if (this->focused == false) {
    pAVar12 = pTVar11->font;
    uVar2 = (pTVar11->fg).r;
    uVar19._0_4_ = (pTVar11->fg).b;
    uVar19._4_4_ = (pTVar11->fg).a;
    iVar13 = (this->super_Widget).x1;
    iVar14 = (this->super_Widget).y1;
    anon_unknown.dwarf_a2e9::UString::UString(&sub,this->text,this->left_pos,-1);
    al_draw_ustr(uVar2,uVar19,(float)iVar13,(float)iVar14,pAVar12,0,sub.ustr);
  }
  else {
    iVar13 = (this->super_Widget).x1;
    end = this->cursor_pos;
    if (0 < (int)end) {
      anon_unknown.dwarf_a2e9::UString::UString(&sub,this->text,this->left_pos,end);
      uVar1 = (pTVar11->fg).r;
      uVar20._0_4_ = (pTVar11->fg).b;
      uVar20._4_4_ = (pTVar11->fg).a;
      al_draw_ustr(uVar1,uVar20,(float)(this->super_Widget).x1,(float)(this->super_Widget).y1,
                   pTVar11->font,0,sub.ustr);
      uVar21 = (undefined4)((ulong)uVar20 >> 0x20);
      iVar14 = al_get_ustr_width(pTVar11->font,sub.ustr);
      iVar13 = iVar14 + iVar13;
      end = this->cursor_pos;
    }
    uVar18 = al_ustr_size(this->text);
    if (uVar18 == end) {
      iVar14 = (this->super_Widget).y1;
      iVar15 = al_get_font_line_height(pTVar11->font);
      uVar5._0_4_ = (pTVar11->fg).r;
      uVar5._4_4_ = (pTVar11->fg).g;
      uVar6._0_4_ = (pTVar11->fg).b;
      uVar6._4_4_ = (pTVar11->fg).a;
      al_draw_filled_rectangle
                ((float)iVar13,CONCAT44(uVar21,(float)iVar14),(float)(iVar13 + 8),
                 (float)(iVar15 + iVar14),uVar5,uVar6);
    }
    else {
      iVar14 = this->cursor_pos;
      al_ustr_next(this->text);
      anon_unknown.dwarf_a2e9::UString::UString(&sub,this->text,this->cursor_pos,iVar14);
      iVar16 = al_get_ustr_width(pTVar11->font,sub.ustr);
      iVar15 = (this->super_Widget).y1;
      iVar17 = al_get_font_line_height(pTVar11->font);
      uVar7._0_4_ = (pTVar11->fg).r;
      uVar7._4_4_ = (pTVar11->fg).g;
      uVar8._0_4_ = (pTVar11->fg).b;
      uVar8._4_4_ = (pTVar11->fg).a;
      al_draw_filled_rectangle
                ((float)iVar13,CONCAT44(uVar21,(float)iVar15),(float)(iVar16 + iVar13),
                 (float)(iVar17 + iVar15),uVar7,uVar8);
      uVar3 = (pTVar11->bg).r;
      uVar9._0_4_ = (pTVar11->bg).b;
      uVar9._4_4_ = (pTVar11->bg).a;
      al_draw_ustr(uVar3,uVar9,(float)iVar13,(float)(this->super_Widget).y1,pTVar11->font,0,sub.ustr
                  );
      pAVar12 = pTVar11->font;
      uVar4 = (pTVar11->fg).r;
      uVar10._0_4_ = (pTVar11->fg).b;
      uVar10._4_4_ = (pTVar11->fg).a;
      iVar15 = (this->super_Widget).y1;
      anon_unknown.dwarf_a2e9::UString::UString(&local_440,this->text,iVar14,-1);
      al_draw_ustr(uVar4,uVar10,(float)(iVar16 + iVar13),(float)iVar15,pAVar12,0,local_440.ustr);
    }
  }
  anon_unknown.dwarf_a2e9::SaveState::~SaveState(&state);
  return;
}

Assistant:

void TextEntry::draw()
{
   const Theme & theme = dialog->get_theme();
   SaveState state;
   ALLEGRO_COLOR bg = theme.bg;

   if (is_disabled()) {
      bg = al_map_rgb(64, 64, 64);
   }

   al_draw_filled_rectangle(x1, y1, x2, y2, bg);

   al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_INVERSE_ALPHA);

   if (!focused) {
      al_draw_ustr(theme.font, theme.fg, x1, y1, 0, UString(text, left_pos));
   }
   else {
      int x = x1;

      if (cursor_pos > 0) {
         UString sub(text, left_pos, cursor_pos);
         al_draw_ustr(theme.font, theme.fg, x1, y1, 0, sub);
         x += al_get_ustr_width(theme.font, sub);
      }

      if ((unsigned) cursor_pos == al_ustr_size(text)) {
         al_draw_filled_rectangle(x, y1, x + CURSOR_WIDTH,
            y1 + al_get_font_line_height(theme.font), theme.fg);
      }
      else {
         int post_cursor = cursor_pos;
         al_ustr_next(text, &post_cursor);

         UString sub(text, cursor_pos, post_cursor);
         int subw = al_get_ustr_width(theme.font, sub);
         al_draw_filled_rectangle(x, y1, x + subw,
            y1 + al_get_font_line_height(theme.font), theme.fg);
         al_draw_ustr(theme.font, theme.bg, x, y1, 0, sub);
         x += subw;

         al_draw_ustr(theme.font, theme.fg, x, y1, 0,
            UString(text, post_cursor));
      }
   }
}